

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InstDebugPrintfPass::GenOutputValues
          (InstDebugPrintfPass *this,Instruction *val_inst,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *val_ids,InstructionBuilder *builder)

{
  initializer_list<unsigned_int> __l;
  uint uVar1;
  InstructionBuilder *pIVar2;
  bool bVar3;
  Kind KVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t operand2;
  IRContext *this_00;
  undefined4 extraout_var;
  Instruction *val_inst_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint32_t local_124;
  Instruction *local_120;
  Instruction *ui32_inst_1;
  Instruction *local_110;
  Instruction *ui32_inst;
  Instruction *ui8_inst;
  Instruction *local_f8;
  Instruction *hi_ui64_inst;
  Instruction *rshift_ui64_inst;
  Instruction *lo_ui64_inst;
  Instruction *ui64_inst_1;
  Integer *i_ty;
  Instruction *local_c8;
  Instruction *bc_inst;
  Instruction *ui64_inst;
  Instruction *f32_inst;
  Float *f_ty;
  Instruction *local_a0;
  Instruction *sel_inst;
  uint32_t one_id;
  uint32_t zero_id;
  iterator local_88;
  size_type local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  Instruction *local_60;
  Instruction *c_inst;
  uint32_t c;
  uint32_t c_ty_id;
  Type *c_ty;
  Vector *v_ty;
  Type *val_ty;
  TypeManager *type_mgr;
  InstructionBuilder *pIStack_28;
  uint32_t val_ty_id;
  InstructionBuilder *builder_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *val_ids_local;
  Instruction *val_inst_local;
  InstDebugPrintfPass *this_local;
  
  pIStack_28 = builder;
  builder_local = (InstructionBuilder *)val_ids;
  val_ids_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)val_inst;
  val_inst_local = (Instruction *)this;
  type_mgr._4_4_ = Instruction::type_id(val_inst);
  this_00 = Pass::context((Pass *)this);
  val_ty = (Type *)IRContext::get_type_mgr(this_00);
  v_ty = (Vector *)analysis::TypeManager::GetType((TypeManager *)val_ty,type_mgr._4_4_);
  KVar4 = analysis::Type::kind((Type *)v_ty);
  switch(KVar4) {
  case kBool:
    sel_inst._4_4_ = InstructionBuilder::GetUintConstantId(pIStack_28,0);
    sel_inst._0_4_ = InstructionBuilder::GetUintConstantId(pIStack_28,1);
    pIVar2 = pIStack_28;
    uVar7 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar6 = Instruction::result_id((Instruction *)val_ids_local);
    local_a0 = InstructionBuilder::AddSelect(pIVar2,uVar7,uVar6,(uint32_t)sel_inst,sel_inst._4_4_);
    pIVar2 = builder_local;
    f_ty._4_4_ = Instruction::result_id(local_a0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar2,
               (value_type_conflict2 *)((long)&f_ty + 4));
    break;
  case kInteger:
    iVar5 = (*(v_ty->super_Type)._vptr_Type[9])();
    ui64_inst_1 = (Instruction *)CONCAT44(extraout_var_01,iVar5);
    uVar7 = analysis::Integer::width((Integer *)ui64_inst_1);
    if (uVar7 == 8) {
      ui32_inst = (Instruction *)val_ids_local;
      bVar3 = analysis::Integer::IsSigned((Integer *)ui64_inst_1);
      pIVar2 = pIStack_28;
      if (bVar3) {
        uVar7 = InstrumentPass::GetUint8Id(&this->super_InstrumentPass);
        uVar6 = Instruction::result_id((Instruction *)val_ids_local);
        ui32_inst = InstructionBuilder::AddUnaryOp(pIVar2,uVar7,OpBitcast,uVar6);
      }
      pIVar2 = pIStack_28;
      uVar7 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
      uVar6 = Instruction::result_id(ui32_inst);
      local_110 = InstructionBuilder::AddUnaryOp(pIVar2,uVar7,OpUConvert,uVar6);
      pIVar2 = builder_local;
      ui32_inst_1._4_4_ = Instruction::result_id(local_110);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar2,
                 (value_type_conflict2 *)((long)&ui32_inst_1 + 4));
    }
    else if (uVar7 == 0x20) {
      local_120 = (Instruction *)val_ids_local;
      bVar3 = analysis::Integer::IsSigned((Integer *)ui64_inst_1);
      pIVar2 = pIStack_28;
      if (bVar3) {
        uVar7 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
        uVar6 = Instruction::result_id((Instruction *)val_ids_local);
        local_120 = InstructionBuilder::AddUnaryOp(pIVar2,uVar7,OpBitcast,uVar6);
      }
      pIVar2 = builder_local;
      local_124 = Instruction::result_id(local_120);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar2,&local_124);
    }
    else {
      if (uVar7 != 0x40) {
        __assert_fail("false && \"unsupported int width\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp"
                      ,0x82,
                      "void spvtools::opt::InstDebugPrintfPass::GenOutputValues(Instruction *, std::vector<uint32_t> *, InstructionBuilder *)"
                     );
      }
      lo_ui64_inst = (Instruction *)val_ids_local;
      bVar3 = analysis::Integer::IsSigned((Integer *)ui64_inst_1);
      pIVar2 = pIStack_28;
      if (bVar3) {
        uVar7 = InstrumentPass::GetUint64Id(&this->super_InstrumentPass);
        uVar6 = Instruction::result_id((Instruction *)val_ids_local);
        lo_ui64_inst = InstructionBuilder::AddUnaryOp(pIVar2,uVar7,OpBitcast,uVar6);
      }
      pIVar2 = pIStack_28;
      uVar7 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
      uVar6 = Instruction::result_id(lo_ui64_inst);
      rshift_ui64_inst = InstructionBuilder::AddUnaryOp(pIVar2,uVar7,OpUConvert,uVar6);
      pIVar2 = pIStack_28;
      uVar7 = InstrumentPass::GetUint64Id(&this->super_InstrumentPass);
      uVar6 = Instruction::result_id(lo_ui64_inst);
      operand2 = InstructionBuilder::GetUintConstantId(pIStack_28,0x20);
      hi_ui64_inst = InstructionBuilder::AddBinaryOp
                               (pIVar2,uVar7,OpShiftRightLogical,uVar6,operand2);
      pIVar2 = pIStack_28;
      uVar7 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
      uVar6 = Instruction::result_id(hi_ui64_inst);
      local_f8 = InstructionBuilder::AddUnaryOp(pIVar2,uVar7,OpUConvert,uVar6);
      pIVar2 = builder_local;
      ui8_inst._4_4_ = Instruction::result_id(rshift_ui64_inst);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar2,
                 (value_type_conflict2 *)((long)&ui8_inst + 4));
      pIVar2 = builder_local;
      ui8_inst._0_4_ = Instruction::result_id(local_f8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar2,
                 (value_type_conflict2 *)&ui8_inst);
    }
    break;
  case kFloat:
    iVar5 = (*(v_ty->super_Type)._vptr_Type[0xb])();
    f32_inst = (Instruction *)CONCAT44(extraout_var_00,iVar5);
    uVar7 = analysis::Float::width((Float *)f32_inst);
    pIVar2 = pIStack_28;
    if (uVar7 == 0x10) {
      uVar7 = InstrumentPass::GetFloatId(&this->super_InstrumentPass);
      uVar6 = Instruction::result_id((Instruction *)val_ids_local);
      ui64_inst = InstructionBuilder::AddUnaryOp(pIVar2,uVar7,OpFConvert,uVar6);
      GenOutputValues(this,ui64_inst,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)builder_local,
                      pIStack_28);
    }
    else if (uVar7 == 0x20) {
      uVar7 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
      uVar6 = Instruction::result_id((Instruction *)val_ids_local);
      local_c8 = InstructionBuilder::AddUnaryOp(pIVar2,uVar7,OpBitcast,uVar6);
      pIVar2 = builder_local;
      i_ty._4_4_ = Instruction::result_id(local_c8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar2,
                 (value_type_conflict2 *)((long)&i_ty + 4));
    }
    else {
      if (uVar7 != 0x40) {
        __assert_fail("false && \"unsupported float width\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp"
                      ,0x4e,
                      "void spvtools::opt::InstDebugPrintfPass::GenOutputValues(Instruction *, std::vector<uint32_t> *, InstructionBuilder *)"
                     );
      }
      uVar7 = InstrumentPass::GetUint64Id(&this->super_InstrumentPass);
      uVar6 = Instruction::result_id((Instruction *)val_ids_local);
      bc_inst = InstructionBuilder::AddUnaryOp(pIVar2,uVar7,OpBitcast,uVar6);
      GenOutputValues(this,bc_inst,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)builder_local,
                      pIStack_28);
    }
    break;
  case kVector:
    iVar5 = (*(v_ty->super_Type)._vptr_Type[0xd])();
    c_ty = (Type *)CONCAT44(extraout_var,iVar5);
    _c = analysis::Vector::element_type((Vector *)c_ty);
    c_inst._4_4_ = analysis::TypeManager::GetId((TypeManager *)val_ty,_c);
    for (c_inst._0_4_ = 0; uVar1 = (uint)c_inst,
        uVar6 = analysis::Vector::element_count((Vector *)c_ty), pIVar2 = pIStack_28,
        uVar7 = c_inst._4_4_, uVar1 < uVar6; c_inst._0_4_ = (uint)c_inst + 1) {
      uVar6 = Instruction::result_id((Instruction *)val_ids_local);
      zero_id = (uint)c_inst;
      local_88 = &zero_id;
      local_80 = 1;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&one_id + 3));
      __l._M_len = local_80;
      __l._M_array = local_88;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_78,__l,(allocator_type *)((long)&one_id + 3));
      val_inst_00 = InstructionBuilder::AddCompositeExtract(pIVar2,uVar7,uVar6,&local_78);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_78);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&one_id + 3));
      local_60 = val_inst_00;
      GenOutputValues(this,val_inst_00,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)builder_local,
                      pIStack_28);
    }
    break;
  default:
    __assert_fail("false && \"unsupported type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp"
                  ,0x87,
                  "void spvtools::opt::InstDebugPrintfPass::GenOutputValues(Instruction *, std::vector<uint32_t> *, InstructionBuilder *)"
                 );
  }
  return;
}

Assistant:

void InstDebugPrintfPass::GenOutputValues(Instruction* val_inst,
                                          std::vector<uint32_t>* val_ids,
                                          InstructionBuilder* builder) {
  uint32_t val_ty_id = val_inst->type_id();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Type* val_ty = type_mgr->GetType(val_ty_id);
  switch (val_ty->kind()) {
    case analysis::Type::kVector: {
      analysis::Vector* v_ty = val_ty->AsVector();
      const analysis::Type* c_ty = v_ty->element_type();
      uint32_t c_ty_id = type_mgr->GetId(c_ty);
      for (uint32_t c = 0; c < v_ty->element_count(); ++c) {
        Instruction* c_inst =
            builder->AddCompositeExtract(c_ty_id, val_inst->result_id(), {c});
        GenOutputValues(c_inst, val_ids, builder);
      }
      return;
    }
    case analysis::Type::kBool: {
      // Select between uint32 zero or one
      uint32_t zero_id = builder->GetUintConstantId(0);
      uint32_t one_id = builder->GetUintConstantId(1);
      Instruction* sel_inst = builder->AddSelect(
          GetUintId(), val_inst->result_id(), one_id, zero_id);
      val_ids->push_back(sel_inst->result_id());
      return;
    }
    case analysis::Type::kFloat: {
      analysis::Float* f_ty = val_ty->AsFloat();
      switch (f_ty->width()) {
        case 16: {
          // Convert float16 to float32 and recurse
          Instruction* f32_inst = builder->AddUnaryOp(
              GetFloatId(), spv::Op::OpFConvert, val_inst->result_id());
          GenOutputValues(f32_inst, val_ids, builder);
          return;
        }
        case 64: {
          // Bitcast float64 to uint64 and recurse
          Instruction* ui64_inst = builder->AddUnaryOp(
              GetUint64Id(), spv::Op::OpBitcast, val_inst->result_id());
          GenOutputValues(ui64_inst, val_ids, builder);
          return;
        }
        case 32: {
          // Bitcase float32 to uint32
          Instruction* bc_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpBitcast, val_inst->result_id());
          val_ids->push_back(bc_inst->result_id());
          return;
        }
        default:
          assert(false && "unsupported float width");
          return;
      }
    }
    case analysis::Type::kInteger: {
      analysis::Integer* i_ty = val_ty->AsInteger();
      switch (i_ty->width()) {
        case 64: {
          Instruction* ui64_inst = val_inst;
          if (i_ty->IsSigned()) {
            // Bitcast sint64 to uint64
            ui64_inst = builder->AddUnaryOp(GetUint64Id(), spv::Op::OpBitcast,
                                            val_inst->result_id());
          }
          // Break uint64 into 2x uint32
          Instruction* lo_ui64_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpUConvert, ui64_inst->result_id());
          Instruction* rshift_ui64_inst = builder->AddBinaryOp(
              GetUint64Id(), spv::Op::OpShiftRightLogical,
              ui64_inst->result_id(), builder->GetUintConstantId(32));
          Instruction* hi_ui64_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpUConvert, rshift_ui64_inst->result_id());
          val_ids->push_back(lo_ui64_inst->result_id());
          val_ids->push_back(hi_ui64_inst->result_id());
          return;
        }
        case 8: {
          Instruction* ui8_inst = val_inst;
          if (i_ty->IsSigned()) {
            // Bitcast sint8 to uint8
            ui8_inst = builder->AddUnaryOp(GetUint8Id(), spv::Op::OpBitcast,
                                           val_inst->result_id());
          }
          // Convert uint8 to uint32
          Instruction* ui32_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpUConvert, ui8_inst->result_id());
          val_ids->push_back(ui32_inst->result_id());
          return;
        }
        case 32: {
          Instruction* ui32_inst = val_inst;
          if (i_ty->IsSigned()) {
            // Bitcast sint32 to uint32
            ui32_inst = builder->AddUnaryOp(GetUintId(), spv::Op::OpBitcast,
                                            val_inst->result_id());
          }
          // uint32 needs no further processing
          val_ids->push_back(ui32_inst->result_id());
          return;
        }
        default:
          // TODO(greg-lunarg): Support non-32-bit int
          assert(false && "unsupported int width");
          return;
      }
    }
    default:
      assert(false && "unsupported type");
      return;
  }
}